

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

string * __thiscall
cmStateSnapshot::GetProjectName_abi_cxx11_(string *__return_storage_ptr__,cmStateSnapshot *this)

{
  PointerType pSVar1;
  PointerType pBVar2;
  
  pSVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar2 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar1->BuildSystemDirectory);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pBVar2->ProjectName);
  return __return_storage_ptr__;
}

Assistant:

std::string cmStateSnapshot::GetProjectName() const
{
  return this->Position->BuildSystemDirectory->ProjectName;
}